

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

nullres nullcBindModuleFunctionWrapper
                  (char *module,void *func,_func_void_void_ptr_char_ptr_char_ptr *ptr,char *name,
                  int index)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  TraceScope traceScope;
  char *errorPos;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    bVar3 = false;
  }
  else {
    if (nullcBindModuleFunctionWrapper::token == '\0') {
      iVar5 = __cxa_guard_acquire(&nullcBindModuleFunctionWrapper::token);
      if (iVar5 != 0) {
        nullcBindModuleFunctionWrapper::token =
             NULLC::TraceGetToken("nullc","nullcBindModuleFunctionWrapper");
        __cxa_guard_release(&nullcBindModuleFunctionWrapper::token);
      }
    }
    NULLC::TraceScope::TraceScope(&traceScope,nullcBindModuleFunctionWrapper::token);
    lVar2 = NULLC::traceContext;
    sVar6 = strlen(module);
    uVar7 = (int)sVar6 + 1;
    uVar4 = *(uint *)(lVar2 + 0x264);
    if ((uVar4 <= *(int *)(lVar2 + 0x260) + uVar7) ||
       (*(int *)(lVar2 + 0x270) == *(int *)(lVar2 + 0x274))) {
      NULLC::TraceDump();
      uVar4 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar4 <= uVar7) {
      __assert_fail("count < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x127,"void NULLC::TraceLabel(const char *)");
    }
    uVar4 = *(uint *)(lVar2 + 0x260);
    memcpy((void *)((ulong)uVar4 + *(long *)(lVar2 + 0x268)),module,(ulong)uVar7);
    *(int *)(lVar2 + 0x260) = *(int *)(lVar2 + 0x260) + uVar7;
    lVar1 = *(long *)(lVar2 + 0x278);
    uVar7 = *(uint *)(lVar2 + 0x270);
    *(uint *)(lVar2 + 0x270) = uVar7 + 1;
    *(uint *)(lVar1 + (ulong)uVar7 * 8) = uVar4 * 4 + 2;
    *(undefined4 *)(lVar1 + 4 + (ulong)uVar7 * 8) = 0;
    if (NULLC::compilerCtx != 0) {
      __assert_fail("!compilerCtx",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/nullc.cpp"
                    ,0x134,
                    "nullres nullcBindModuleFunctionWrapper(const char *, void *, void (*)(void *, char *, char *), const char *, int)"
                   );
    }
    if (func == (void *)0x0) {
      __assert_fail("func",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/nullc.cpp"
                    ,0x136,
                    "nullres nullcBindModuleFunctionWrapper(const char *, void *, void (*)(void *, char *, char *), const char *, int)"
                   );
    }
    errorPos = (char *)0x0;
    bVar3 = AddModuleFunction((Allocator *)NULLC::allocator,module,(_func_void *)0x0,func,ptr,name,
                              index,&errorPos,NULLC::errorBuf,0x10000,NULLC::optimizationLevel);
    if (!bVar3) {
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
                ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
      NULLC::nullcLastError = NULLC::errorBuf;
    }
    else {
      GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::Clear
                ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)NULLC::allocator);
    }
    bVar3 = bVar3;
    NULLC::TraceScope::~TraceScope(&traceScope);
  }
  return bVar3;
}

Assistant:

nullres nullcBindModuleFunctionWrapper(const char* module, void *func, void (*ptr)(void *func, char* retBuf, char* argBuf), const char* name, int index)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcBindModuleFunctionWrapper");
	TRACE_LABEL(module);

	assert(!compilerCtx);

	assert(func);

	const char *errorPos = NULL;

	if(!AddModuleFunction(&allocator, module, NULL, func, ptr, name, index, &errorPos, errorBuf, NULLC_ERROR_BUFFER_SIZE, NULLC::optimizationLevel))
	{
		allocator.Clear();

		nullcLastError = errorBuf;

		return false;
	}

	allocator.Clear();

	return true;
}